

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionDatatypeValidator.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::UnionDatatypeValidator::init(UnionDatatypeValidator *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  uint extraout_EAX;
  KVStringPair *toCopy;
  XMLCh *pXVar3;
  InvalidDatatypeFacetException *this_00;
  RefArrayVectorOf<char16_t> *pRVar4;
  BaseRefVectorOf<char16_t> *pBVar5;
  XMLSize_t XVar6;
  char16_t *pcVar7;
  RefArrayVectorOf<char16_t> *in_RCX;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *in_RDX;
  MemoryManager *in_R8;
  UnionDatatypeValidator *pBaseValidator;
  XMLException *anon_var_0;
  XMLSize_t enumLength;
  XMLSize_t i;
  KVStringPair pair;
  undefined1 local_70 [8];
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  XMLCh *value;
  XMLCh *key;
  MemoryManager *manager_local;
  RefArrayVectorOf<char16_t> *enums_local;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets_local;
  DatatypeValidator *baseValidator_local;
  UnionDatatypeValidator *this_local;
  
  if (in_RCX != (RefArrayVectorOf<char16_t> *)0x0) {
    setEnumeration(this,in_RCX,false);
  }
  if (in_RDX != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               local_70,in_RDX,false,in_R8);
    while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
                   hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                                    *)local_70), bVar1) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>
                            *)local_70);
      KVStringPair::KVStringPair((KVStringPair *)&i,toCopy);
      pXVar3 = KVStringPair::getKey((KVStringPair *)&i);
      e.fMemoryManager = (MemoryManager *)KVStringPair::getValue((KVStringPair *)&i);
      bVar1 = XMLString::equals(pXVar3,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
      if (!bVar1) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/UnionDatatypeValidator.cpp"
                   ,0xa2,FACET_Invalid_Tag,pXVar3,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,in_R8);
        __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      DatatypeValidator::setPattern(&this->super_DatatypeValidator,(XMLCh *)e.fMemoryManager);
      pXVar3 = DatatypeValidator::getPattern(&this->super_DatatypeValidator);
      if (pXVar3 != (XMLCh *)0x0) {
        DatatypeValidator::setFacetsDefined(&this->super_DatatypeValidator,8);
      }
      KVStringPair::~KVStringPair((KVStringPair *)&i);
    }
    uVar2 = DatatypeValidator::getFacetsDefined(&this->super_DatatypeValidator);
    if (((uVar2 & 0x10) != 0) &&
       (pRVar4 = getEnumeration(this), pRVar4 != (RefArrayVectorOf<char16_t> *)0x0)) {
      enumLength = 0;
      pBVar5 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
      XVar6 = BaseRefVectorOf<char16_t>::size(pBVar5);
      for (; enumLength < XVar6; enumLength = enumLength + 1) {
        pBVar5 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
        pcVar7 = BaseRefVectorOf<char16_t>::elementAt(pBVar5,enumLength);
        (**(code **)(*(long *)ctx + 0x40))(ctx,pcVar7,0,in_R8);
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
               local_70);
  }
  uVar2 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)ctx);
  uVar2 = uVar2 & 0x10;
  if (uVar2 != 0) {
    uVar2 = DatatypeValidator::getFacetsDefined(&this->super_DatatypeValidator);
    uVar2 = uVar2 & 0x10;
    if (uVar2 == 0) {
      pRVar4 = getEnumeration((UnionDatatypeValidator *)ctx);
      setEnumeration(this,pRVar4,true);
      uVar2 = extraout_EAX;
    }
  }
  return uVar2;
}

Assistant:

void UnionDatatypeValidator::init(DatatypeValidator*            const baseValidator
                                , RefHashTableOf<KVStringPair>* const facets
                                , RefArrayVectorOf<XMLCh>*      const enums
                                , MemoryManager*                const manager)
{
    if (enums)
        setEnumeration(enums, false);

    // Set Facets if any defined
    if (facets)
    {
        XMLCh* key;
        XMLCh* value;
        RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

        while (e.hasMoreElements())
        {
            KVStringPair pair = e.nextElement();
            key = pair.getKey();
            value = pair.getValue();

            if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
            {
                setPattern(value);
                if (getPattern())
                    setFacetsDefined(DatatypeValidator::FACET_PATTERN);
                // do not construct regex until needed
            }
            else
            {
                 ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                         , XMLExcepts::FACET_Invalid_Tag
                         , key
                         , manager);
            }
        }//while

        /***
           Schema constraint: Part I -- self checking
        ***/
        // Nil

        /***
           Schema constraint: Part II base vs derived checking
        ***/
        // check 4.3.5.c0 must: enumeration values from the value space of base
        if ( ((getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) != 0) &&
            (getEnumeration() !=0))
        {
            XMLSize_t i = 0;
            XMLSize_t enumLength = getEnumeration()->size();
            try
            {
                for ( ; i < enumLength; i++)
                {
                    // ask parent do a complete check
                    //
                    // enum need NOT be passed this->checkContent()
                    // since there are no other facets for Union, parent
                    // checking is good enough.
                    //
                    baseValidator->validate(getEnumeration()->elementAt(i), (ValidationContext*)0, manager);

                }
            }

            catch ( XMLException& )
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                            , XMLExcepts::FACET_enum_base
                            , getEnumeration()->elementAt(i)
                            , manager);
            }
        }

    }// End of Facet setting

    /***
        Inherit facets from base.facets

        The reason of this inheriting (or copying values) is to ease
        schema constraint checking, so that we need NOT trace back to our
        very first base validator in the hierachy. Instead, we are pretty
        sure checking against immediate base validator is enough.
    ***/

    UnionDatatypeValidator *pBaseValidator = (UnionDatatypeValidator*) baseValidator;

    // inherit enumeration
    if (((pBaseValidator->getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) !=0) &&
        ((getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) == 0))
    {
        setEnumeration(pBaseValidator->getEnumeration(), true);
    }

}